

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

cs_insn * cs_malloc(csh ud)

{
  void *pvVar1;
  cs_struct *handle;
  cs_insn *insn;
  csh ud_local;
  
  ud_local = (csh)(*cs_mem_malloc)(0xf0);
  if ((void *)ud_local == (void *)0x0) {
    *(undefined4 *)(ud + 0x58) = 1;
    ud_local = 0;
  }
  else if (*(int *)(ud + 0x68) == 0) {
    *(undefined8 *)(ud_local + 0xe8) = 0;
  }
  else {
    pvVar1 = (*cs_mem_malloc)(0x5f8);
    *(void **)(ud_local + 0xe8) = pvVar1;
    if (*(long *)(ud_local + 0xe8) == 0) {
      (*cs_mem_free)((void *)ud_local);
      *(undefined4 *)(ud + 0x58) = 1;
      ud_local = 0;
    }
  }
  return (cs_insn *)ud_local;
}

Assistant:

CAPSTONE_EXPORT
cs_insn *cs_malloc(csh ud)
{
	cs_insn *insn;
	struct cs_struct *handle = (struct cs_struct *)(uintptr_t)ud;

	insn = cs_mem_malloc(sizeof(cs_insn));
	if (!insn) {
		// insufficient memory
		handle->errnum = CS_ERR_MEM;
		return NULL;
	} else {
		if (handle->detail) {
			// allocate memory for @detail pointer
			insn->detail = cs_mem_malloc(sizeof(cs_detail));
			if (insn->detail == NULL) {	// insufficient memory
				cs_mem_free(insn);
				handle->errnum = CS_ERR_MEM;
				return NULL;
			}
		} else
			insn->detail = NULL;
	}

	return insn;
}